

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expand.c
# Opt level: O0

int compare_expressions(void *userdata,void *_a,void *_b)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  uint local_4c;
  unsigned_long b_pos;
  unsigned_long a_pos;
  expression *b;
  expression *a;
  dmr_C *C;
  void *_b_local;
  void *_a_local;
  void *userdata_local;
  
  uVar1 = bit_offset((dmr_C *)userdata,(expression *)_a);
  uVar2 = bit_offset((dmr_C *)userdata,(expression *)_b);
  if (uVar1 < uVar2) {
    local_4c = 0xffffffff;
  }
  else {
    local_4c = (uint)(uVar1 != uVar2);
  }
  return local_4c;
}

Assistant:

static int compare_expressions(void *userdata, const void *_a, const void *_b)
{
	struct dmr_C *C = (struct dmr_C *) userdata;
	const struct expression *a = (const struct expression *)_a;
	const struct expression *b = (const struct expression *)_b;
	unsigned long a_pos = bit_offset(C, a);
	unsigned long b_pos = bit_offset(C, b);

	return (a_pos < b_pos) ? -1 : (a_pos == b_pos) ? 0 : 1;
}